

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superAnd.c
# Opt level: O3

char * Super2_LibWriteGate_rec(Super2_Gate_t *pGate,int fInv,int Level)

{
  byte bVar1;
  byte bVar2;
  Super2_Gate_t *pSVar3;
  char *__s;
  char *__src;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  undefined8 uVar8;
  byte *__dest;
  undefined8 uVar9;
  uint fInv_00;
  uint fInv_01;
  
  if (Level < 0) {
    __assert_fail("Level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/super/superAnd.c"
                  ,0x253,"char *Super2_LibWriteGate_rec(Super2_Gate_t *, int, int)");
  }
  __dest = (byte *)Super2_LibWriteGate_rec::pBuffs1[Level];
  pSVar3 = pGate->pOne;
  if (pSVar3 == (Super2_Gate_t *)0x0) {
    if (pGate->uTruth != 0) {
      *__dest = (fInv == 0) * ' ' + *(char *)&pGate->pTwo + 0x41;
      __dest[1] = 0;
      return (char *)__dest;
    }
    *__dest = fInv == 0 ^ 0x31;
    __dest[1] = 0x24;
    __dest[2] = 0;
    return (char *)__dest;
  }
  if (Level == 0) {
    __assert_fail("Level > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/super/superAnd.c"
                  ,0x263,"char *Super2_LibWriteGate_rec(Super2_Gate_t *, int, int)");
  }
  __s = Super2_LibWriteGate_rec::pBuffs2[Level];
  fInv_01 = (uint)pSVar3 & 1;
  __src = Super2_LibWriteGate_rec
                    ((Super2_Gate_t *)((ulong)pSVar3 & 0xfffffffffffffffe),fInv_01,Level + -1);
  strcpy((char *)__dest,__src);
  fInv_00 = (uint)pGate->pTwo & 1;
  pbVar4 = (byte *)Super2_LibWriteGate_rec
                             ((Super2_Gate_t *)((ulong)pGate->pTwo & 0xfffffffffffffffe),fInv_00,
                              Level + -1);
  pbVar5 = __dest;
  pbVar7 = pbVar4;
  pbVar6 = pbVar4;
  if (fInv_01 == fInv_00) {
LAB_0040d0b2:
    do {
      bVar1 = *pbVar5;
      pbVar5 = pbVar5 + 1;
      if (bVar1 != 0) {
        if ((char)bVar1 < 'A') goto LAB_0040d0b2;
      }
      do {
        bVar2 = *pbVar7;
        pbVar7 = pbVar7 + 1;
        if (bVar2 == 0) break;
      } while ((char)bVar2 < 'A');
      if ((bVar1 == 0) || (bVar2 == 0)) {
        if (bVar2 != 0) goto LAB_0040d171;
        goto LAB_0040d0f1;
      }
    } while (bVar1 == bVar2);
    if ((char)bVar2 <= (char)bVar1) {
LAB_0040d0f1:
      uVar8 = 0x3c;
      if (fInv == 0) {
        uVar8 = 0x28;
      }
      uVar9 = 0x3e;
      if (fInv == 0) {
        uVar9 = 0x29;
      }
      goto LAB_0040d19f;
    }
LAB_0040d171:
    uVar8 = 0x3c;
    if (fInv == 0) {
      uVar8 = 0x28;
    }
    uVar9 = 0x3e;
    if (fInv == 0) {
      uVar9 = 0x29;
    }
  }
  else {
    uVar8 = 0x3c;
    if (fInv == 0) {
      uVar8 = 0x28;
    }
    uVar9 = 0x3e;
    if (fInv == 0) {
      uVar9 = 0x29;
    }
    if (fInv_01 <= fInv_00) goto LAB_0040d19f;
  }
  pbVar6 = __dest;
  __dest = pbVar4;
LAB_0040d19f:
  sprintf(__s,"%c%s%s%c",uVar8,pbVar6,__dest,uVar9);
  return __s;
}

Assistant:

char * Super2_LibWriteGate_rec( Super2_Gate_t * pGate, int fInv, int Level )
{
    static char Buff01[  3], Buff02[  3];    // Max0              =  1
    static char Buff11[  6], Buff12[  6];    // Max1 = 2*Max0 + 2 =  4
    static char Buff21[ 12], Buff22[ 12];    // Max2 = 2*Max1 + 2 = 10
    static char Buff31[ 25], Buff32[ 25];    // Max3 = 2*Max2 + 2 = 22
    static char Buff41[ 50], Buff42[ 50];    // Max4 = 2*Max3 + 2 = 46
    static char Buff51[100], Buff52[100];    // Max5 = 2*Max4 + 2 = 94
    static char * pBuffs1[6] = { Buff01, Buff11, Buff21, Buff31, Buff41, Buff51 };
    static char * pBuffs2[6] = { Buff02, Buff12, Buff22, Buff32, Buff42, Buff52 };
    char * pBranch;
    char * pBuffer1 = pBuffs1[Level];
    char * pBuffer2 = pBuffs2[Level];
    Super2_Gate_t * pGateNext1, * pGateNext2;
    int fInvNext1, fInvNext2;
    int RetValue;

    // consider the last level
    assert( Level >= 0 );
    if ( pGate->pOne == NULL )
    {
        if ( pGate->uTruth == 0 )
        {
            pBuffer1[0] = (fInv? '1': '0');
            pBuffer1[1] = '$';
            pBuffer1[2] = 0;
        }
        else
        {
            pBuffer1[0] = (fInv? 'A' + ((int)(ABC_PTRUINT_T)pGate->pTwo): 'a' + ((int)(ABC_PTRUINT_T)pGate->pTwo));
            pBuffer1[1] = 0;
        }
        return pBuffer1;
    }
    assert( Level > 0 );


    // get the left branch
    pGateNext1 = Super2_Regular(pGate->pOne);
    fInvNext1  = Super2_IsComplement(pGate->pOne);
    pBranch    = Super2_LibWriteGate_rec(pGateNext1, fInvNext1, Level - 1);
    // copy into Buffer1
    strcpy( pBuffer1, pBranch );

    // get the right branch
    pGateNext2 = Super2_Regular(pGate->pTwo);
    fInvNext2  = Super2_IsComplement(pGate->pTwo);
    pBranch    = Super2_LibWriteGate_rec(pGateNext2, fInvNext2, Level - 1);

    // consider the case when comparison is not necessary
    if ( fInvNext1 ^ fInvNext2 )
    {
        if ( fInvNext1 > fInvNext2 )
            sprintf( pBuffer2, "%c%s%s%c", (fInv? '<': '('), pBuffer1, pBranch, (fInv? '>': ')') );
        else
            sprintf( pBuffer2, "%c%s%s%c", (fInv? '<': '('), pBranch, pBuffer1, (fInv? '>': ')') );
    }
    else
    {
        // compare the two branches
        RetValue = Super2_LibWriteCompare( pBuffer1, pBranch );
        if ( RetValue == 1 )
            sprintf( pBuffer2, "%c%s%s%c", (fInv? '<': '('), pBuffer1, pBranch, (fInv? '>': ')') );
        else // if ( RetValue == -1 )
        {
            sprintf( pBuffer2, "%c%s%s%c", (fInv? '<': '('), pBranch, pBuffer1, (fInv? '>': ')') );
            if ( RetValue == 0 )
                printf( "Strange!\n" );
        }
    }
    return pBuffer2;
}